

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiDockNode *
DockBuilderCopyNodeRec
          (ImGuiDockNode *src_node,ImGuiID dst_node_id_if_known,
          ImVector<unsigned_int> *out_node_remap_pairs)

{
  uint uVar1;
  uint uVar2;
  ImGuiDockNode *v;
  ImGuiDockNode *pIVar3;
  long lVar4;
  
  v = ImGui::DockContextAddNode(GImGui,dst_node_id_if_known);
  uVar1 = src_node->SharedFlags;
  v->SharedFlags = uVar1;
  uVar2 = src_node->LocalFlags;
  v->LocalFlags = uVar2;
  v->LocalFlagsInWindows = 0;
  v->Pos = src_node->Pos;
  v->Size = src_node->Size;
  v->SizeRef = src_node->SizeRef;
  v->SplitAxis = src_node->SplitAxis;
  v->MergedFlags = uVar2 | uVar1;
  ImVector<unsigned_int>::push_back(out_node_remap_pairs,&src_node->ID);
  ImVector<unsigned_int>::push_back(out_node_remap_pairs,&v->ID);
  for (lVar4 = 4; lVar4 != 6; lVar4 = lVar4 + 1) {
    if (src_node->ChildNodes[lVar4 + -4] != (ImGuiDockNode *)0x0) {
      pIVar3 = DockBuilderCopyNodeRec(src_node->ChildNodes[lVar4 + -4],0,out_node_remap_pairs);
      v->ChildNodes[lVar4 + -4] = pIVar3;
      pIVar3->ParentNode = v;
    }
  }
  return v;
}

Assistant:

static ImGuiDockNode* DockBuilderCopyNodeRec(ImGuiDockNode* src_node, ImGuiID dst_node_id_if_known, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockNode* dst_node = ImGui::DockContextAddNode(ctx, dst_node_id_if_known);
    dst_node->SharedFlags = src_node->SharedFlags;
    dst_node->LocalFlags = src_node->LocalFlags;
    dst_node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    dst_node->Pos = src_node->Pos;
    dst_node->Size = src_node->Size;
    dst_node->SizeRef = src_node->SizeRef;
    dst_node->SplitAxis = src_node->SplitAxis;
    dst_node->UpdateMergedFlags();

    out_node_remap_pairs->push_back(src_node->ID);
    out_node_remap_pairs->push_back(dst_node->ID);

    for (int child_n = 0; child_n < IM_ARRAYSIZE(src_node->ChildNodes); child_n++)
        if (src_node->ChildNodes[child_n])
        {
            dst_node->ChildNodes[child_n] = DockBuilderCopyNodeRec(src_node->ChildNodes[child_n], 0, out_node_remap_pairs);
            dst_node->ChildNodes[child_n]->ParentNode = dst_node;
        }

    IMGUI_DEBUG_LOG_DOCKING("Fork node %08X -> %08X (%d childs)\n", src_node->ID, dst_node->ID, dst_node->IsSplitNode() ? 2 : 0);
    return dst_node;
}